

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *pZVar1;
  anon_enum_32 aVar2;
  size_t sVar3;
  archive *a;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ZSTD_inBuffer in;
  
  in.pos = 0;
  pZVar1 = &data->out;
  sVar9 = (data->out).pos;
  in.src = src;
  in.size = length;
  do {
    sVar3 = in.pos;
    aVar2 = data->state;
    if (aVar2 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar2 == finishing) {
      lVar5 = ZSTD_endStream(data->cstream,pZVar1);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) {
LAB_00144cc3:
        a = f->archive;
        uVar6 = ZSTD_getErrorName(lVar5);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar6);
        return -0x1e;
      }
      if (lVar5 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar2 == running) {
      if (in.pos == in.size) {
        return 0;
      }
      lVar5 = ZSTD_compressStream(data->cstream,pZVar1,&in);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) goto LAB_00144cc3;
    }
    data->total_in = data->total_in + (in.pos - sVar3);
    uVar7 = (in.pos - sVar3) + data->cur_frame_in;
    data->cur_frame_in = uVar7;
    sVar3 = (data->out).pos;
    uVar8 = (sVar3 - sVar9) + data->cur_frame_out;
    data->cur_frame_out = uVar8;
    if ((data->state == running) &&
       ((data->max_frame_in <= uVar7 || (data->max_frame_out <= uVar8)))) {
      data->state = finishing;
    }
    if ((sVar3 == (data->out).size) || (sVar9 = sVar3, flush != 0 && sVar3 != 0)) {
      iVar4 = __archive_write_filter(f->next_filter,pZVar1->dst,sVar3);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
      sVar9 = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int flush, const void *src, size_t length)
{
	ZSTD_inBuffer in = { .src = src, .size = length, .pos = 0 };
	size_t ipos, opos, zstdret = 0;
	int ret;

	for (;;) {
		ipos = in.pos;
		opos = data->out.pos;
		switch (data->state) {
		case running:
			if (in.pos == in.size)
				return (ARCHIVE_OK);
			zstdret = ZSTD_compressStream(data->cstream,
			    &data->out, &in);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			break;
		case finishing:
			zstdret = ZSTD_endStream(data->cstream, &data->out);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			if (zstdret == 0)
				data->state = resetting;
			break;
		case resetting:
			ZSTD_CCtx_reset(data->cstream, ZSTD_reset_session_only);
			data->cur_frame++;
			data->cur_frame_in = 0;
			data->cur_frame_out = 0;
			data->state = running;
			break;
		}
		data->total_in += in.pos - ipos;
		data->cur_frame_in += in.pos - ipos;
		data->cur_frame_out += data->out.pos - opos;
		if (data->state == running) {
			if (data->cur_frame_in >= data->max_frame_in ||
			    data->cur_frame_out >= data->max_frame_out) {
				data->state = finishing;
			}
		}
		if (data->out.pos == data->out.size ||
		    (flush && data->out.pos > 0)) {
			ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.pos);
			if (ret != ARCHIVE_OK)
				goto fatal;
			data->out.pos = 0;
		}
	}
zstd_fatal:
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Zstd compression failed: %s",
	    ZSTD_getErrorName(zstdret));
fatal:
	return (ARCHIVE_FATAL);
}